

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIFT.cpp
# Opt level: O2

void rescale(Mat *colorfulImage,Mat *image)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int in_R8D;
  int local_78;
  uint local_74;
  _InputArray local_70;
  undefined4 local_58 [2];
  Mat *local_50;
  undefined8 local_48;
  Mat *local_40;
  undefined8 local_38;
  
  local_48 = 0;
  local_70.sz.width = 0;
  local_70.sz.height = 0;
  local_58[0] = 0x1010000;
  local_70.flags = 0x2010000;
  local_70.obj = image;
  local_50 = colorfulImage;
  local_40 = colorfulImage;
  cv::cvtColor((cv *)local_58,&local_70,(_OutputArray *)0x6,0,in_R8D);
  while (600 < image->rows) {
    local_48 = 0;
    local_70.sz.width = 0;
    local_70.sz.height = 0;
    local_58[0] = 0x1010000;
    local_70.flags = 0x2010000;
    local_78 = image->cols / 2;
    local_74 = (uint)image->rows >> 1;
    local_70.obj = image;
    local_50 = image;
    cv::resize(local_58,&local_70,&local_78,1);
    local_48 = 0;
    local_58[0] = 0x1010000;
    local_50 = local_40;
    local_70.sz.width = 0;
    local_70.sz.height = 0;
    local_70.flags = 0x2010000;
    local_70.obj = local_40;
    uVar1 = local_40->rows;
    uVar2 = local_40->cols;
    local_38 = CONCAT44((int)uVar1 / 2,(int)uVar2 / 2);
    cv::resize(0,0,local_58,&local_70,&local_38,1);
  }
  return;
}

Assistant:

void rescale(Mat& colorfulImage, Mat& image){
    cvtColor(colorfulImage, image, COLOR_BGR2GRAY);
    // Shrink the image size
    while(image.rows > 600){
        resize(image, image, Size(image.cols/2,image.rows/2)); 
        resize(colorfulImage, colorfulImage, Size(colorfulImage.cols/2,colorfulImage.rows/2));
    }
}